

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclableObject.cpp
# Opt level: O0

HRESULT __thiscall
Js::RecyclableObject::QueryObjectInterface(RecyclableObject *this,IID *riid,void **ppvObj)

{
  code *pcVar1;
  bool bVar2;
  ScriptContext *this_00;
  ThreadContext *this_01;
  undefined4 *puVar3;
  void **ppvObj_local;
  IID *riid_local;
  RecyclableObject *this_local;
  
  this_00 = GetScriptContext(this);
  this_01 = ScriptContext::GetThreadContext(this_00);
  bVar2 = ThreadContext::IsScriptActive(this_01);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/RecyclableObject.cpp"
                                ,0x14a,
                                "(!this->GetScriptContext()->GetThreadContext()->IsScriptActive())",
                                "!this->GetScriptContext()->GetThreadContext()->IsScriptActive()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  return -0x7fffbffe;
}

Assistant:

HRESULT RecyclableObject::QueryObjectInterface(REFIID riid, void **ppvObj)
    {
        Assert(!this->GetScriptContext()->GetThreadContext()->IsScriptActive());
        return E_NOINTERFACE;
    }